

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O2

FScanner * __thiscall FScanner::operator=(FScanner *this,FScanner *other)

{
  BYTE BVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  
  bVar9 = 0;
  if (this != other) {
    if (other->ScriptOpen == false) {
      Close(this);
    }
    else {
      this->ScriptOpen = true;
      FString::operator=(&this->ScriptName,&other->ScriptName);
      FString::operator=(&this->ScriptBuffer,&other->ScriptBuffer);
      pcVar5 = other->ScriptEndPtr;
      this->ScriptPtr = other->ScriptPtr;
      this->ScriptEndPtr = pcVar5;
      this->AlreadyGot = other->AlreadyGot;
      this->AlreadyGotLine = other->AlreadyGotLine;
      this->LastGotToken = other->LastGotToken;
      this->LastGotPtr = other->LastGotPtr;
      this->LastGotLine = other->LastGotLine;
      BVar1 = other->StateMode;
      bVar2 = other->StateOptions;
      bVar3 = other->Escape;
      this->CMode = other->CMode;
      this->StateMode = BVar1;
      this->StateOptions = bVar2;
      this->Escape = bVar3;
      if (other->String == other->StringBuffer) {
        pcVar5 = this->StringBuffer;
        pcVar7 = other->StringBuffer;
        pcVar8 = pcVar5;
        for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(undefined8 *)pcVar8 = *(undefined8 *)pcVar7;
          pcVar7 = pcVar7 + (ulong)bVar9 * -0x10 + 8;
          pcVar8 = pcVar8 + (ulong)bVar9 * -0x10 + 8;
        }
        FString::operator=(&this->BigStringBuffer,(char *)"");
      }
      else {
        FString::operator=(&this->BigStringBuffer,&other->BigStringBuffer);
        pcVar5 = FString::LockBuffer(&this->BigStringBuffer);
      }
      this->String = pcVar5;
      iVar4 = other->TokenType;
      this->StringLen = other->StringLen;
      this->TokenType = iVar4;
      this->Number = other->Number;
      this->Float = other->Float;
      iVar4 = other->Line;
      this->Name = (FName)(other->Name).Index;
      this->Line = iVar4;
      this->End = other->End;
      this->Crossed = other->Crossed;
    }
  }
  return this;
}

Assistant:

FScanner &FScanner::operator=(const FScanner &other)
{
	if (this == &other)
	{
		return *this;
	}
	if (!other.ScriptOpen)
	{
		Close();
		return *this;
	}

	// Copy protected members
	ScriptOpen = true;
	ScriptName = other.ScriptName;
	ScriptBuffer = other.ScriptBuffer;
	ScriptPtr = other.ScriptPtr;
	ScriptEndPtr = other.ScriptEndPtr;
	AlreadyGot = other.AlreadyGot;
	AlreadyGotLine = other.AlreadyGotLine;
	LastGotToken = other.LastGotToken;
	LastGotPtr = other.LastGotPtr;
	LastGotLine = other.LastGotLine;
	CMode = other.CMode;
	Escape = other.Escape;
	StateMode = other.StateMode;
	StateOptions = other.StateOptions;

	// Copy public members
	if (other.String == other.StringBuffer)
	{
		memcpy(StringBuffer, other.StringBuffer, sizeof(StringBuffer));
		BigStringBuffer = "";
		String = StringBuffer;
	}
	else
	{
		// Past practice means the string buffer must be writeable, which
		// removes some of the benefit from using an FString to store
		// the big string buffer.
		BigStringBuffer = other.BigStringBuffer;
		String = BigStringBuffer.LockBuffer();
	}
	StringLen = other.StringLen;
	TokenType = other.TokenType;
	Number = other.Number;
	Float = other.Float;
	Name = other.Name;
	Line = other.Line;
	End = other.End;
	Crossed = other.Crossed;

	return *this;
}